

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

void __thiscall google::protobuf::MapValueRef::DeleteData(MapValueRef *this)

{
  long *plVar1;
  undefined8 *puVar2;
  
  switch((this->super_MapValueConstRef).type_) {
  case CPPTYPE_INT32:
  case CPPTYPE_INT64:
  case CPPTYPE_UINT32:
  case CPPTYPE_UINT64:
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_BOOL:
  case CPPTYPE_ENUM:
    operator_delete((this->super_MapValueConstRef).data_);
    return;
  case CPPTYPE_STRING:
    puVar2 = (undefined8 *)(this->super_MapValueConstRef).data_;
    if ((puVar2 != (undefined8 *)0x0) && ((undefined8 *)*puVar2 != puVar2 + 2)) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
    return;
  case CPPTYPE_MESSAGE:
    plVar1 = (long *)(this->super_MapValueConstRef).data_;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
      return;
    }
  }
  return;
}

Assistant:

void DeleteData() {
    switch (type_) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    delete reinterpret_cast<TYPE*>(data_);   \
    break;                                   \
  }
      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, std::string);
      HANDLE_TYPE(ENUM, int32_t);
      HANDLE_TYPE(MESSAGE, Message);
#undef HANDLE_TYPE
    }
  }